

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebuggerVariablesHelper.cxx
# Opt level: O1

Dummies * CreateDummies(Dummies *__return_storage_ptr__,string *targetName,
                       string *currentSourceDirectory,string *currentBinaryDirectory)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __uniq_ptr_impl<cmState,_std::default_delete<cmState>_> this;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar2;
  PositionType PVar3;
  cmStateSnapshot snapshot;
  undefined1 local_79;
  cmStateDirectory local_78;
  element_type *local_48;
  cmStateSnapshot local_40;
  
  (__return_storage_ptr__->GlobalGenerator).
  super___shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->GlobalGenerator).
  super___shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->Makefile).super___shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->Makefile).super___shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->CMake).super___shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->CMake).super___shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40.State = (cmState *)CONCAT44(local_40.State._4_4_,2);
  local_48 = (element_type *)CONCAT44(local_48._4_4_,1);
  local_78.DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cmake,std::allocator<cmake>,cmake::Role,cmState::Mode>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.DirectoryState.Position,
             (cmake **)&local_78,(allocator<cmake> *)&local_79,(Role *)&local_40,(Mode *)&local_48);
  PVar3 = local_78.DirectoryState.Position;
  pcVar2 = local_78.DirectoryState.Tree;
  local_78.DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  local_78.DirectoryState.Position = 0;
  p_Var1 = (__return_storage_ptr__->CMake).super___shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (__return_storage_ptr__->CMake).super___shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pcVar2;
  (__return_storage_ptr__->CMake).super___shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)PVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.DirectoryState.Position !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.DirectoryState.Position);
  }
  local_40.State =
       (cmState *)
       (__return_storage_ptr__->CMake).super___shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
  super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
       (((element_type *)local_40.State)->State)._M_t.
       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t;
  local_78.DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cmGlobalGenerator,std::allocator<cmGlobalGenerator>,cmake*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.DirectoryState.Position,
             (cmGlobalGenerator **)&local_78,(allocator<cmGlobalGenerator> *)&local_48,
             (cmake **)&local_40);
  PVar3 = local_78.DirectoryState.Position;
  pcVar2 = local_78.DirectoryState.Tree;
  local_78.DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  local_78.DirectoryState.Position = 0;
  p_Var1 = (__return_storage_ptr__->GlobalGenerator).
           super___shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (__return_storage_ptr__->GlobalGenerator).
  super___shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)pcVar2;
  (__return_storage_ptr__->GlobalGenerator).
  super___shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)PVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.DirectoryState.Position !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.DirectoryState.Position);
  }
  cmState::CreateBaseSnapshot
            (&local_40,
             (cmState *)
             this._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  cmStateSnapshot::GetDirectory(&local_78,&local_40);
  cmStateDirectory::SetCurrentSource(&local_78,currentSourceDirectory);
  cmStateSnapshot::GetDirectory(&local_78,&local_40);
  cmStateDirectory::SetCurrentBinary(&local_78,currentBinaryDirectory);
  local_48 = (__return_storage_ptr__->GlobalGenerator).
             super___shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cmMakefile,std::allocator<cmMakefile>,cmGlobalGenerator*,cmStateSnapshot&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.DirectoryState.Position,
             (cmMakefile **)&local_78,(allocator<cmMakefile> *)&local_79,&local_48,&local_40);
  PVar3 = local_78.DirectoryState.Position;
  pcVar2 = local_78.DirectoryState.Tree;
  local_78.DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  local_78.DirectoryState.Position = 0;
  p_Var1 = (__return_storage_ptr__->Makefile).
           super___shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (__return_storage_ptr__->Makefile).super___shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pcVar2;
  (__return_storage_ptr__->Makefile).super___shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)PVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.DirectoryState.Position !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.DirectoryState.Position);
  }
  cmMakefile::CreateNewTarget
            ((__return_storage_ptr__->Makefile).
             super___shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2>._M_ptr,targetName,EXECUTABLE
             ,Yes,Normal);
  return __return_storage_ptr__;
}

Assistant:

static Dummies CreateDummies(
  std::string targetName,
  std::string currentSourceDirectory = "c:/CurrentSourceDirectory",
  std::string currentBinaryDirectory = "c:/CurrentBinaryDirectory")
{
  Dummies dummies;
  dummies.CMake =
    std::make_shared<cmake>(cmake::RoleProject, cmState::Project);
  cmState* state = dummies.CMake->GetState();
  dummies.GlobalGenerator =
    std::make_shared<cmGlobalGenerator>(dummies.CMake.get());
  cmStateSnapshot snapshot = state->CreateBaseSnapshot();
  snapshot.GetDirectory().SetCurrentSource(currentSourceDirectory);
  snapshot.GetDirectory().SetCurrentBinary(currentBinaryDirectory);
  dummies.Makefile =
    std::make_shared<cmMakefile>(dummies.GlobalGenerator.get(), snapshot);
  dummies.Makefile->CreateNewTarget(targetName, cmStateEnums::EXECUTABLE);
  return dummies;
}